

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

void av1_rd_pick_palette_intra_sby
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int dc_mode_cost,
               MB_MODE_INFO *best_mbmi,uint8_t *best_palette_color_map,int64_t *best_rd,int *rate,
               int *rate_tokenonly,int64_t *distortion,uint8_t *skippable,int *beat_best_rd,
               PICK_MODE_CONTEXT *ctx,uint8_t *best_blk_skip,uint8_t *tx_type_map)

{
  uint8_t uVar1;
  byte bVar2;
  aom_bit_depth_t bit_depth;
  SequenceHeader *pSVar3;
  byte bVar4;
  uint uVar5;
  MACROBLOCK *pMVar6;
  undefined8 uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var;
  BLOCK_SIZE bsize_00;
  int iVar11;
  long lVar12;
  ulong uVar13;
  MACROBLOCKD *pMVar14;
  ulong uVar15;
  AV1_COMP *cpi_00;
  uint8_t *puVar16;
  ulong uVar17;
  ushort uVar18;
  int16_t *piVar19;
  uint uVar20;
  byte *src;
  undefined8 uVar21;
  MB_MODE_INFO *mbmi;
  uint uVar22;
  uint lower_bound;
  uint upper_bound;
  int cols;
  int rows;
  MACROBLOCK *local_4508;
  MB_MODE_INFO *local_4500;
  int unused;
  MB_MODE_INFO *local_44f0;
  int16_t *local_44e8;
  AV1_COMP *local_44e0;
  int last_n_searched;
  int colors;
  ulong local_44d0;
  int *local_44c8;
  MACROBLOCKD *local_44c0;
  uint8_t *local_44b8;
  ulong local_44b0;
  int colors_threshold;
  undefined8 local_44a0;
  ulong local_4498;
  uint8_t *local_4490;
  int block_height;
  int block_width;
  ulong local_4480;
  size_t local_4478;
  uint local_446c;
  int16_t top_colors [8];
  uint16_t color_cache [16];
  int count_buf_8bit [256];
  int count_buf [4096];
  
  local_44c0 = &x->e_mbd;
  local_4500 = *(x->e_mbd).mi;
  iVar8 = x->plane[0].src.stride;
  src = x->plane[0].src.buf;
  local_4508 = x;
  local_44b8 = best_palette_color_map;
  av1_get_block_dimensions(bsize,0,local_44c0,&block_width,&block_height,&rows,&cols);
  pSVar3 = (cpi->common).seq_params;
  uVar1 = pSVar3->use_highbitdepth;
  bit_depth = pSVar3->bit_depth;
  local_4498 = (ulong)(uint)(cpi->sf).rt_sf.use_nonrd_pick_mode;
  colors_threshold = 0;
  local_44c8 = (int *)CONCAT71(local_44c8._1_7_,uVar1);
  local_44b0 = CONCAT44(local_44b0._4_4_,bit_depth);
  local_44e0 = cpi;
  if (uVar1 == '\0') {
    av1_count_colors(src,iVar8,rows,cols,count_buf,&colors);
    colors_threshold = colors;
  }
  else {
    av1_count_colors_highbd
              (src,iVar8,rows,cols,bit_depth,count_buf,count_buf_8bit,&colors_threshold,&colors);
  }
  iVar11 = local_4508->color_palette_thresh;
  uVar13 = (ulong)bsize;
  iVar10 = iVar11;
  if (((((local_44e0->sf).rt_sf.use_nonrd_pick_mode != 0) &&
       ((local_44e0->sf).rt_sf.increase_color_thresh_palette == true)) &&
      ((local_44e0->rc).high_source_sad != 0)) && (0x32 < local_4508->source_variance)) {
    if ((local_4508->color_sensitivity[0] == '\0') && (local_4508->color_sensitivity[1] == '\0')) {
      iVar10 = iVar11 + 0x14;
    }
    else {
      lVar12 = local_4508->min_dist_inter_uv >> (""[uVar13] + ""[uVar13] & 0x3f);
      if (local_4508->color_sensitivity[0] != '\0') {
        lVar12 = lVar12 >> (local_4508->color_sensitivity[1] != '\0');
      }
      iVar10 = iVar11 + 0x14;
      if (7999 < lVar12) {
        iVar10 = iVar11;
      }
    }
  }
  puVar16 = (local_4508->e_mbd).plane[0].color_index_map;
  mbmi = local_4500;
  if ((colors_threshold < 2) || (iVar10 < colors_threshold)) goto LAB_001c71a1;
  local_44e8 = local_4508->palette_buffer->kmeans_data_buf;
  if ((char)local_44c8 == '\0') {
    iVar11 = 0;
    uVar15 = 0;
    if (0 < cols) {
      uVar15 = (ulong)(uint)cols;
    }
    iVar10 = rows;
    if (rows < 1) {
      iVar10 = 0;
    }
    lower_bound = (uint)*src;
    piVar19 = local_44e8;
    upper_bound = lower_bound;
    for (; iVar11 != iVar10; iVar11 = iVar11 + 1) {
      for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
        uVar18 = (ushort)src[uVar17];
        piVar19[uVar17] = uVar18;
        if (uVar18 <= lower_bound) {
          lower_bound = (uint)uVar18;
        }
        if (upper_bound <= uVar18) {
          upper_bound = (uint)uVar18;
        }
      }
      src = src + iVar8;
      piVar19 = piVar19 + cols;
    }
  }
  else {
    lower_bound = (uint)*(ushort *)((long)src * 2);
    lVar12 = (long)src * 2;
    iVar11 = 0;
    uVar15 = 0;
    if (0 < cols) {
      uVar15 = (ulong)(uint)cols;
    }
    iVar10 = rows;
    if (rows < 1) {
      iVar10 = 0;
    }
    piVar19 = local_44e8;
    upper_bound = lower_bound;
    for (; iVar11 != iVar10; iVar11 = iVar11 + 1) {
      for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
        uVar18 = *(ushort *)(lVar12 + uVar17 * 2);
        piVar19[uVar17] = uVar18;
        if (uVar18 <= lower_bound) {
          lower_bound = (uint)uVar18;
        }
        if (upper_bound <= uVar18) {
          upper_bound = (uint)uVar18;
        }
      }
      piVar19 = piVar19 + cols;
      lVar12 = lVar12 + (long)iVar8 * 2;
    }
  }
  uVar15 = 0;
  local_4500->mode = '\0';
  (local_4500->filter_intra_mode_info).use_filter_intra = '\0';
  local_44f0 = best_mbmi;
  local_44d0 = uVar13;
  local_4490 = puVar16;
  iVar8 = av1_get_palette_cache(local_44c0,0,color_cache);
  local_44a0 = CONCAT44(extraout_var,iVar8);
  uVar20 = colors;
  if (7 < colors) {
    uVar20 = 8;
  }
  top_colors[0] = 0;
  top_colors[1] = 0;
  top_colors[2] = 0;
  top_colors[3] = 0;
  top_colors[4] = 0;
  top_colors[5] = 0;
  top_colors[6] = 0;
  top_colors[7] = 0;
  count_buf_8bit[0xc] = 0;
  count_buf_8bit[0xd] = 0;
  count_buf_8bit[0xe] = 0;
  count_buf_8bit[0xf] = 0;
  count_buf_8bit[8] = 0;
  count_buf_8bit[9] = 0;
  count_buf_8bit[10] = 0;
  count_buf_8bit[0xb] = 0;
  count_buf_8bit[4] = 0;
  count_buf_8bit[5] = 0;
  count_buf_8bit[6] = 0;
  count_buf_8bit[7] = 0;
  count_buf_8bit[0] = 0;
  count_buf_8bit[1] = 0;
  count_buf_8bit[2] = 0;
  count_buf_8bit[3] = 0;
  bVar4 = (byte)local_44b0 & 0x1f;
  local_446c = uVar20 - 1;
  local_4480 = (ulong)local_446c;
  local_44c0 = (MACROBLOCKD *)(long)(int)local_446c;
  local_446c = (int)local_446c >> 0x1f & local_446c;
  uVar13 = (ulong)(uint)(1 << bVar4);
  if (1 << bVar4 < 1) {
    uVar13 = uVar15;
  }
  local_4478 = (size_t)(int)uVar20;
  uVar22 = 0;
  local_44b0 = uVar13;
  for (; uVar21 = local_44a0, puVar16 = local_44b8, uVar15 != uVar13; uVar15 = uVar15 + 1) {
    iVar8 = count_buf[uVar15];
    if (0 < iVar8) {
      if ((int)uVar22 < (int)uVar20) {
        count_buf_8bit[(long)(int)uVar22 * 2] = (int)uVar15;
        count_buf_8bit[(long)(int)uVar22 * 2 + 1] = iVar8;
        uVar22 = uVar22 + 1;
        if (uVar22 == uVar20) {
          qsort(count_buf_8bit,local_4478,8,color_count_comp);
          uVar13 = local_44b0;
          uVar22 = uVar20;
        }
      }
      else {
        uVar17 = local_4480;
        uVar5 = uVar20;
        if (count_buf_8bit[(long)local_44c0 * 2 + 1] < iVar8) {
          do {
            uVar9 = local_446c;
            if ((int)uVar17 < 1) break;
            uVar9 = uVar5 - 1;
            lVar12 = uVar17 * 2;
            uVar17 = uVar17 - 1;
            uVar5 = uVar9;
          } while (count_buf_8bit[lVar12 + -1] < iVar8);
          local_44c8 = count_buf_8bit + (long)(int)uVar9 * 2 + 2;
          memmove(local_44c8,count_buf_8bit + (long)(int)uVar9 * 2,(long)(int)(~uVar9 + uVar20) << 3
                 );
          local_44c8[-2] = (int)uVar15;
          local_44c8[-1] = iVar8;
          uVar13 = local_44b0;
        }
      }
    }
  }
  uVar15 = 0;
  uVar13 = (ulong)uVar20;
  if ((int)uVar20 < 1) {
    uVar13 = uVar15;
  }
  for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
    top_colors[uVar15] = (int16_t)count_buf_8bit[uVar15 * 2];
  }
  iVar8 = (local_44e0->sf).intra_sf.prune_luma_palette_size_search_level;
  local_44b0 = CONCAT44(local_44b0._4_4_,iVar8);
  iVar11 = (int)local_4498;
  if (colors < 3 || (local_44e0->sf).intra_sf.prune_palette_search_level != 1) {
    pMVar14 = (MACROBLOCKD *)0x8;
    if (colors < 8) {
      pMVar14 = (MACROBLOCKD *)(ulong)(uint)colors;
    }
    last_n_searched = 2;
    iVar10 = (int)pMVar14;
    local_44c8 = (int *)(ulong)(iVar10 + 1U);
    perform_top_color_palette_search
              (local_44e0,local_4508,local_4500,(BLOCK_SIZE)local_44d0,dc_mode_cost,local_44e8,
               top_colors,2,iVar10 + 1U,1,iVar8 != 0,&last_n_searched,color_cache,(int)local_44a0,
               local_44f0,local_44b8,best_rd,rate,rate_tokenonly,distortion,skippable,beat_best_rd,
               ctx,best_blk_skip,tx_type_map,iVar11);
    local_44c0 = pMVar14;
    if (last_n_searched < iVar10) {
      perform_top_color_palette_search
                (local_44e0,local_4508,local_4500,(BLOCK_SIZE)local_44d0,dc_mode_cost,local_44e8,
                 top_colors,iVar10,last_n_searched,-1,false,&unused,color_cache,(int)local_44a0,
                 local_44f0,puVar16,best_rd,rate,rate_tokenonly,distortion,skippable,beat_best_rd,
                 ctx,best_blk_skip,tx_type_map,iVar11);
    }
    uVar21 = local_44a0;
    cpi_00 = local_44e0;
    mbmi = local_4500;
    bsize_00 = (BLOCK_SIZE)local_44d0;
    if (colors == 2) {
      count_buf_8bit[0]._2_2_ = (short)upper_bound;
      count_buf_8bit[0]._0_2_ = (short)lower_bound;
      palette_rd_y(local_44e0,local_4508,local_4500,bsize_00,dc_mode_cost,local_44e8,
                   (int16_t *)count_buf_8bit,2,color_cache,(int)local_44a0,false,local_44f0,puVar16,
                   best_rd,rate,rate_tokenonly,distortion,skippable,beat_best_rd,ctx,best_blk_skip,
                   tx_type_map,(int *)0x0,(_Bool *)0x0,iVar11);
      puVar16 = local_4490;
      best_mbmi = local_44f0;
      goto LAB_001c71a1;
    }
    last_n_searched = 2;
    perform_k_means_palette_search
              (local_44e0,local_4508,local_4500,bsize_00,dc_mode_cost,local_44e8,lower_bound,
               upper_bound,2,(int)local_44c8,1,(int)local_44b0 != 0,&last_n_searched,color_cache,
               (int)local_44a0,local_44f0,puVar16,best_rd,rate,rate_tokenonly,distortion,skippable,
               beat_best_rd,ctx,best_blk_skip,tx_type_map,local_4490,cols * rows,iVar11);
    puVar16 = local_4490;
    best_mbmi = local_44f0;
    if ((int)local_44c0 <= last_n_searched) goto LAB_001c71a1;
    iVar11 = cols * rows;
    iVar10 = -1;
    pMVar14 = local_44c0;
    iVar8 = last_n_searched;
  }
  else {
    pMVar14 = (MACROBLOCKD *)0x8;
    if ((uint)colors < 8) {
      pMVar14 = (MACROBLOCKD *)(ulong)(uint)colors;
    }
    bVar4 = *(byte *)((long)pMVar14[0x127].plane[2].seg_iqmatrix[5] + 0x4e);
    local_44c8 = (int *)(ulong)bVar4;
    bVar2 = *(byte *)((long)pMVar14[0x127].plane[2].seg_iqmatrix[5] + 0x57);
    local_4478 = (size_t)bVar2;
    iVar10 = (int)pMVar14;
    local_4480 = (ulong)(iVar10 + 1U);
    iVar8 = perform_top_color_palette_search
                      (local_44e0,local_4508,local_4500,(BLOCK_SIZE)local_44d0,dc_mode_cost,
                       local_44e8,top_colors,(uint)bVar4,iVar10 + 1U,(uint)bVar2,iVar8 != 0,&unused,
                       color_cache,(int)local_44a0,local_44f0,local_44b8,best_rd,rate,rate_tokenonly
                       ,distortion,skippable,beat_best_rd,ctx,best_blk_skip,tx_type_map,iVar11);
    uVar7 = local_44a0;
    if (iVar8 <= iVar10) {
      iVar11 = 3;
      if (3 < iVar8) {
        iVar11 = iVar8;
      }
      iVar11 = iVar11 + -1;
      if (iVar8 == 2) {
        iVar11 = 3;
      }
      if (iVar8 == iVar10) {
        iVar10 = iVar10 + -1;
      }
      else {
        if (6 < iVar8) {
          iVar8 = 7;
        }
        iVar10 = iVar8 + 1;
      }
      iVar8 = iVar10 - iVar11;
      if (iVar8 < 2) {
        iVar8 = 1;
      }
      local_44c0 = pMVar14;
      perform_top_color_palette_search
                (local_44e0,local_4508,local_4500,(BLOCK_SIZE)local_44d0,dc_mode_cost,local_44e8,
                 top_colors,iVar11,iVar10 + 1,iVar8,false,&unused,color_cache,(int)local_44a0,
                 local_44f0,local_44b8,best_rd,rate,rate_tokenonly,distortion,skippable,beat_best_rd
                 ,ctx,best_blk_skip,tx_type_map,(int)local_4498);
      pMVar14 = local_44c0;
      uVar21 = uVar7;
    }
    iVar11 = perform_k_means_palette_search
                       (local_44e0,local_4508,local_4500,(BLOCK_SIZE)local_44d0,dc_mode_cost,
                        local_44e8,lower_bound,upper_bound,(int)local_44c8,(int)local_4480,
                        (int)local_4478,(int)local_44b0 != 0,&unused,color_cache,(int)uVar21,
                        local_44f0,local_44b8,best_rd,rate,rate_tokenonly,distortion,skippable,
                        beat_best_rd,ctx,best_blk_skip,tx_type_map,local_4490,cols * rows,
                        (int)local_4498);
    iVar8 = (int)pMVar14;
    puVar16 = local_4490;
    mbmi = local_4500;
    best_mbmi = local_44f0;
    if (iVar8 < iVar11) goto LAB_001c71a1;
    iVar10 = 3;
    if (3 < iVar11) {
      iVar10 = iVar11;
    }
    pMVar14 = (MACROBLOCKD *)(ulong)(iVar10 - 1);
    if (iVar11 == 2) {
      pMVar14 = (MACROBLOCKD *)0x3;
    }
    if (iVar11 == iVar8) {
      iVar8 = iVar8 + -1;
    }
    else {
      iVar8 = 7;
      if (iVar11 < 7) {
        iVar8 = iVar11;
      }
      iVar8 = iVar8 + 1;
    }
    iVar11 = iVar8 - (int)pMVar14;
    iVar10 = 1;
    if (1 < iVar11) {
      iVar10 = iVar11;
    }
    iVar11 = cols * rows;
    bsize_00 = (BLOCK_SIZE)local_44d0;
    cpi_00 = local_44e0;
    iVar8 = iVar8 + 1;
  }
  perform_k_means_palette_search
            (cpi_00,local_4508,mbmi,bsize_00,dc_mode_cost,local_44e8,lower_bound,upper_bound,
             (int)pMVar14,iVar8,iVar10,false,&unused,color_cache,(int)uVar21,local_44f0,local_44b8,
             best_rd,rate,rate_tokenonly,distortion,skippable,beat_best_rd,ctx,best_blk_skip,
             tx_type_map,local_4490,iVar11,(int)local_4498);
  puVar16 = local_4490;
  best_mbmi = local_44f0;
LAB_001c71a1:
  pMVar6 = local_4508;
  if ((best_mbmi->palette_mode_info).palette_size[0] != '\0') {
    memcpy(puVar16,local_44b8,(long)block_height * (long)block_width);
    pMVar6->palette_pixels = pMVar6->palette_pixels + block_height * block_width;
  }
  memcpy(mbmi,best_mbmi,0xb0);
  return;
}

Assistant:

void av1_rd_pick_palette_intra_sby(
    const AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize, int dc_mode_cost,
    MB_MODE_INFO *best_mbmi, uint8_t *best_palette_color_map, int64_t *best_rd,
    int *rate, int *rate_tokenonly, int64_t *distortion, uint8_t *skippable,
    int *beat_best_rd, PICK_MODE_CONTEXT *ctx, uint8_t *best_blk_skip,
    uint8_t *tx_type_map) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  assert(av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                           bsize));
  assert(PALETTE_MAX_SIZE == 8);
  assert(PALETTE_MIN_SIZE == 2);

  const int src_stride = x->plane[0].src.stride;
  const uint8_t *const src = x->plane[0].src.buf;
  int block_width, block_height, rows, cols;
  av1_get_block_dimensions(bsize, 0, xd, &block_width, &block_height, &rows,
                           &cols);
  const SequenceHeader *const seq_params = cpi->common.seq_params;
  const int is_hbd = seq_params->use_highbitdepth;
  const int bit_depth = seq_params->bit_depth;
  const int discount_color_cost = cpi->sf.rt_sf.use_nonrd_pick_mode;
  int unused;

  int count_buf[1 << 12];  // Maximum (1 << 12) color levels.
  int colors, colors_threshold = 0;
  if (is_hbd) {
    int count_buf_8bit[1 << 8];  // Maximum (1 << 8) bins for hbd path.
    av1_count_colors_highbd(src, src_stride, rows, cols, bit_depth, count_buf,
                            count_buf_8bit, &colors_threshold, &colors);
  } else {
    av1_count_colors(src, src_stride, rows, cols, count_buf, &colors);
    colors_threshold = colors;
  }

  uint8_t *const color_map = xd->plane[0].color_index_map;
  int color_thresh_palette = x->color_palette_thresh;
  // Allow for larger color_threshold for palette search, based on color,
  // scene_change, and block source variance.
  // Since palette is Y based, only allow larger threshold if block
  // color_dist is below threshold.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode &&
      cpi->sf.rt_sf.increase_color_thresh_palette && cpi->rc.high_source_sad &&
      x->source_variance > 50) {
    int64_t norm_color_dist = 0;
    if (x->color_sensitivity[0] || x->color_sensitivity[1]) {
      norm_color_dist = x->min_dist_inter_uv >>
                        (mi_size_wide_log2[bsize] + mi_size_high_log2[bsize]);
      if (x->color_sensitivity[0] && x->color_sensitivity[1])
        norm_color_dist = norm_color_dist >> 1;
    }
    if (norm_color_dist < 8000) color_thresh_palette += 20;
  }
  if (colors_threshold > 1 && colors_threshold <= color_thresh_palette) {
    int16_t *const data = x->palette_buffer->kmeans_data_buf;
    int16_t centroids[PALETTE_MAX_SIZE];
    int lower_bound, upper_bound;
    fill_data_and_get_bounds(src, src_stride, rows, cols, is_hbd, data,
                             &lower_bound, &upper_bound);

    mbmi->mode = DC_PRED;
    mbmi->filter_intra_mode_info.use_filter_intra = 0;

    uint16_t color_cache[2 * PALETTE_MAX_SIZE];
    const int n_cache = av1_get_palette_cache(xd, 0, color_cache);

    // Find the dominant colors, stored in top_colors[].
    int16_t top_colors[PALETTE_MAX_SIZE] = { 0 };
    find_top_colors(count_buf, bit_depth, AOMMIN(colors, PALETTE_MAX_SIZE),
                    top_colors);

    // The following are the approaches used for header rdcost based gating
    // for early termination for different values of prune_palette_search_level.
    // 0: Pruning based on header rdcost for ascending order palette_size
    // search.
    // 1: When colors > PALETTE_MIN_SIZE, enabled only for coarse palette_size
    // search and for finer search do_header_rd_based_gating parameter is
    // explicitly passed as 'false'.
    // 2: Enabled only for ascending order palette_size search and for
    // descending order search do_header_rd_based_gating parameter is explicitly
    // passed as 'false'.
    const bool do_header_rd_based_gating =
        cpi->sf.intra_sf.prune_luma_palette_size_search_level != 0;

    // TODO(huisu@google.com): Try to avoid duplicate computation in cases
    // where the dominant colors and the k-means results are similar.
    if ((cpi->sf.intra_sf.prune_palette_search_level == 1) &&
        (colors > PALETTE_MIN_SIZE)) {
      // Start index and step size below are chosen to evaluate unique
      // candidates in neighbor search, in case a winner candidate is found in
      // coarse search. Example,
      // 1) 8 colors (end_n = 8): 2,3,4,5,6,7,8. start_n is chosen as 2 and step
      // size is chosen as 3. Therefore, coarse search will evaluate 2, 5 and 8.
      // If winner is found at 5, then 4 and 6 are evaluated. Similarly, for 2
      // (3) and 8 (7).
      // 2) 7 colors (end_n = 7): 2,3,4,5,6,7. If start_n is chosen as 2 (same
      // as for 8 colors) then step size should also be 2, to cover all
      // candidates. Coarse search will evaluate 2, 4 and 6. If winner is either
      // 2 or 4, 3 will be evaluated. Instead, if start_n=3 and step_size=3,
      // coarse search will evaluate 3 and 6. For the winner, unique neighbors
      // (3: 2,4 or 6: 5,7) would be evaluated.

      // Start index for coarse palette search for dominant colors and k-means
      const uint8_t start_n_lookup_table[PALETTE_MAX_SIZE + 1] = { 0, 0, 0,
                                                                   3, 3, 2,
                                                                   3, 3, 2 };
      // Step size for coarse palette search for dominant colors and k-means
      const uint8_t step_size_lookup_table[PALETTE_MAX_SIZE + 1] = { 0, 0, 0,
                                                                     3, 3, 3,
                                                                     3, 3, 3 };

      // Choose the start index and step size for coarse search based on number
      // of colors
      const int max_n = AOMMIN(colors, PALETTE_MAX_SIZE);
      const int min_n = start_n_lookup_table[max_n];
      const int step_size = step_size_lookup_table[max_n];
      assert(min_n >= PALETTE_MIN_SIZE);
      // Perform top color coarse palette search to find the winner candidate
      const int top_color_winner = perform_top_color_palette_search(
          cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, min_n, max_n + 1,
          step_size, do_header_rd_based_gating, &unused, color_cache, n_cache,
          best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
          distortion, skippable, beat_best_rd, ctx, best_blk_skip, tx_type_map,
          discount_color_cost);
      // Evaluate neighbors for the winner color (if winner is found) in the
      // above coarse search for dominant colors
      if (top_color_winner <= max_n) {
        int stage2_min_n, stage2_max_n, stage2_step_size;
        set_stage2_params(&stage2_min_n, &stage2_max_n, &stage2_step_size,
                          top_color_winner, max_n);
        // perform finer search for the winner candidate
        perform_top_color_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, stage2_min_n,
            stage2_max_n + 1, stage2_step_size,
            /*do_header_rd_based_gating=*/false, &unused, color_cache, n_cache,
            best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
            distortion, skippable, beat_best_rd, ctx, best_blk_skip,
            tx_type_map, discount_color_cost);
      }
      // K-means clustering.
      // Perform k-means coarse palette search to find the winner candidate
      const int k_means_winner = perform_k_means_palette_search(
          cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
          min_n, max_n + 1, step_size, do_header_rd_based_gating, &unused,
          color_cache, n_cache, best_mbmi, best_palette_color_map, best_rd,
          rate, rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
          best_blk_skip, tx_type_map, color_map, rows * cols,
          discount_color_cost);
      // Evaluate neighbors for the winner color (if winner is found) in the
      // above coarse search for k-means
      if (k_means_winner <= max_n) {
        int start_n_stage2, end_n_stage2, step_size_stage2;
        set_stage2_params(&start_n_stage2, &end_n_stage2, &step_size_stage2,
                          k_means_winner, max_n);
        // perform finer search for the winner candidate
        perform_k_means_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
            start_n_stage2, end_n_stage2 + 1, step_size_stage2,
            /*do_header_rd_based_gating=*/false, &unused, color_cache, n_cache,
            best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
            distortion, skippable, beat_best_rd, ctx, best_blk_skip,
            tx_type_map, color_map, rows * cols, discount_color_cost);
      }
    } else {
      const int max_n = AOMMIN(colors, PALETTE_MAX_SIZE),
                min_n = PALETTE_MIN_SIZE;
      // Perform top color palette search in ascending order
      int last_n_searched = min_n;
      perform_top_color_palette_search(
          cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, min_n, max_n + 1,
          1, do_header_rd_based_gating, &last_n_searched, color_cache, n_cache,
          best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
          distortion, skippable, beat_best_rd, ctx, best_blk_skip, tx_type_map,
          discount_color_cost);
      if (last_n_searched < max_n) {
        // Search in descending order until we get to the previous best
        perform_top_color_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, max_n,
            last_n_searched, -1, /*do_header_rd_based_gating=*/false, &unused,
            color_cache, n_cache, best_mbmi, best_palette_color_map, best_rd,
            rate, rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
            best_blk_skip, tx_type_map, discount_color_cost);
      }
      // K-means clustering.
      if (colors == PALETTE_MIN_SIZE) {
        // Special case: These colors automatically become the centroids.
        assert(colors == 2);
        centroids[0] = lower_bound;
        centroids[1] = upper_bound;
        palette_rd_y(cpi, x, mbmi, bsize, dc_mode_cost, data, centroids, colors,
                     color_cache, n_cache, /*do_header_rd_based_gating=*/false,
                     best_mbmi, best_palette_color_map, best_rd, rate,
                     rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
                     best_blk_skip, tx_type_map, NULL, NULL,
                     discount_color_cost);
      } else {
        // Perform k-means palette search in ascending order
        last_n_searched = min_n;
        perform_k_means_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
            min_n, max_n + 1, 1, do_header_rd_based_gating, &last_n_searched,
            color_cache, n_cache, best_mbmi, best_palette_color_map, best_rd,
            rate, rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
            best_blk_skip, tx_type_map, color_map, rows * cols,
            discount_color_cost);
        if (last_n_searched < max_n) {
          // Search in descending order until we get to the previous best
          perform_k_means_palette_search(
              cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
              max_n, last_n_searched, -1, /*do_header_rd_based_gating=*/false,
              &unused, color_cache, n_cache, best_mbmi, best_palette_color_map,
              best_rd, rate, rate_tokenonly, distortion, skippable,
              beat_best_rd, ctx, best_blk_skip, tx_type_map, color_map,
              rows * cols, discount_color_cost);
        }
      }
    }
  }

  if (best_mbmi->palette_mode_info.palette_size[0] > 0) {
    memcpy(color_map, best_palette_color_map,
           block_width * block_height * sizeof(best_palette_color_map[0]));
    // Gather the stats to determine whether to use screen content tools in
    // function av1_determine_sc_tools_with_encoding().
    x->palette_pixels += (block_width * block_height);
  }
  *mbmi = *best_mbmi;
}